

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-otpc.cpp
# Opt level: O1

void __thiscall server::server(server *this,io_service *io_service,int port)

{
  element_type *peVar1;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  
  this->io_service_ = io_service;
  uStack_40 = 0;
  uStack_3c = 0;
  local_38 = 0;
  uStack_34 = 0;
  uStack_30 = 0;
  local_48._2_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_48._0_2_ = 2;
  local_48._4_4_ = 0;
  boost::asio::
  basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket_acceptor<boost::asio::io_context>
            (&this->acceptor_,io_service,(endpoint_type *)&local_48,true,(type *)0x0);
  local_48 = (code *)this->io_service_;
  boost::
  make_shared<connection,boost::reference_wrapper<boost::asio::io_context>const,connection::hide_me>
            ((reference_wrapper<boost::asio::io_context> *)&this->new_connection_,
             (hide_me *)&local_48);
  peVar1 = (this->new_connection_).px;
  if (peVar1 != (element_type *)0x0) {
    local_48 = handle_accept;
    uStack_40 = 0;
    uStack_3c = 0;
    _local_38 = this;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
    async_accept<boost::asio::basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::_bi::bind_t<void,boost::_mfi::mf1<void,server,boost::system::error_code_const&>,boost::_bi::list2<boost::_bi::value<server*>,boost::arg<1>(*)()>>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              ((this->acceptor_).impl_.service_,&(this->acceptor_).impl_.implementation_,
               &(peVar1->socket_).
                super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               ,(endpoint_type *)0x0,
               (bind_t<void,_boost::_mfi::mf1<void,_server,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<server_*>,_boost::arg<1>_(*)()>_>
                *)&local_48,&(this->acceptor_).impl_.executor_);
    return;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<connection>::operator->() const [T = connection]"
               );
}

Assistant:

server::server(ba::io_service& io_service,int port)
	: io_service_(io_service),
	  acceptor_(io_service_, ba::ip::tcp::endpoint(ba::ip::tcp::v4(), port)),
	  new_connection_(connection::create(io_service_)) {
	// start acceptor in async mode
	acceptor_.async_accept(new_connection_->socket(),
						   boost::bind(&server::handle_accept, this,
									   ba::placeholders::error));
}